

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recall_tree.cc
# Opt level: O0

double recall_tree_ns::updated_entropy(recall_tree *b,uint32_t cn,example *ec)

{
  float fVar1;
  node_pred *pnVar2;
  node *pnVar3;
  node_pred **ppnVar4;
  long in_RDX;
  uint in_ESI;
  long in_RDI;
  double __x;
  double dVar5;
  double dVar6;
  double newentropy;
  double nminusc0overnp1;
  double lognovernp1;
  double novernp1;
  double n;
  double deltac0;
  double c0;
  node_pred *ls;
  double local_70;
  double dVar7;
  double n_00;
  example *in_stack_ffffffffffffffa0;
  node_pred *c;
  undefined8 in_stack_ffffffffffffffa8;
  recall_tree *in_stack_ffffffffffffffb0;
  
  pnVar2 = find(in_stack_ffffffffffffffb0,(uint32_t)((ulong)in_stack_ffffffffffffffa8 >> 0x20),
                in_stack_ffffffffffffffa0);
  c = pnVar2;
  pnVar3 = v_array<recall_tree_ns::node>::operator[]
                     ((v_array<recall_tree_ns::node> *)(in_RDI + 0x10),(ulong)in_ESI);
  ppnVar4 = v_array<recall_tree_ns::node_pred>::end(&pnVar3->preds);
  if (c == *ppnVar4) {
    dVar7 = 0.0;
  }
  else {
    dVar7 = pnVar2->label_count;
  }
  fVar1 = *(float *)(in_RDX + 0x6870);
  n_00 = dVar7;
  pnVar3 = v_array<recall_tree_ns::node>::operator[]
                     ((v_array<recall_tree_ns::node> *)(in_RDI + 0x10),(ulong)in_ESI);
  dVar5 = pnVar3->n;
  __x = dVar5 / ((double)fVar1 + dVar5);
  if ((__x != 0.0) || (NAN(__x))) {
    local_70 = log(__x);
  }
  else {
    local_70 = 0.0;
  }
  dVar5 = (dVar5 - dVar7) / (dVar5 + (double)fVar1);
  pnVar3 = v_array<recall_tree_ns::node>::operator[]
                     ((v_array<recall_tree_ns::node> *)(in_RDI + 0x10),(ulong)in_ESI);
  dVar7 = pnVar3->entropy;
  dVar6 = plogp((double)c,n_00);
  dVar7 = -local_70 * dVar5 + __x * (dVar6 + dVar7);
  dVar5 = plogp((double)c,n_00);
  return dVar7 - dVar5;
}

Assistant:

double updated_entropy(recall_tree& b, uint32_t cn, example& ec)
{
  node_pred* ls = find(b, cn, ec);

  // entropy = -\sum_k (c_k/n) Log[c_k/n]
  // c_0 <- c_0 + 1, n <- n + 1
  // entropy <- + (c_0/n) Log[c_0/n]
  //            - n/(n+1) \sum_{k>0} (c_k/n) Log[c_k/n]
  //            - Log[n/(n+1)] \sum_{k>0} (c_k/(n+1))
  //            - ((c_0+1)/(n+1)) Log[(c_0+1)/(n+1)]

  double c0 = (ls == b.nodes[cn].preds.end()) ? 0 : ls->label_count;
  double deltac0 = ec.weight;
  double n = b.nodes[cn].n;

  double novernp1 = n / (deltac0 + n);
  double lognovernp1 = (novernp1 == 0) ? 0 : log(novernp1);
  double nminusc0overnp1 = (n - c0) / (n + deltac0);

  double newentropy = b.nodes[cn].entropy;

  newentropy += plogp(c0, n);
  newentropy *= novernp1;
  newentropy -= lognovernp1 * nminusc0overnp1;
  newentropy -= plogp(c0 + deltac0, n + deltac0);

  return newentropy;
}